

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::InputLess<tcu::Matrix<float,_2,_2>_>::operator()
          (InputLess<tcu::Matrix<float,_2,_2>_> *this,Matrix<float,_2,_2> *mat1,
          Matrix<float,_2,_2> *mat2)

{
  Vector<float,_2> *val1;
  Vector<float,_2> *val2;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  bVar2 = inputLess<tcu::Vector<float,2>>((Vector<float,_2> *)mat1,(Vector<float,_2> *)mat2);
  bVar3 = true;
  if (!bVar2) {
    val1 = (mat1->m_data).m_data + 1;
    val2 = (mat2->m_data).m_data + 1;
    bVar6 = 1;
    bVar1 = 1;
    do {
      bVar5 = bVar1;
      bVar2 = inputLess<tcu::Vector<float,2>>((Vector<float,_2> *)mat2,(Vector<float,_2> *)mat1);
      bVar4 = bVar5 ^ 1;
      if (bVar4 != 0 || bVar2) {
        if (bVar2) {
          bVar5 = bVar6;
        }
        break;
      }
      bVar3 = inputLess<tcu::Vector<float,2>>(val1,val2);
      mat2 = (Matrix<float,_2,_2> *)val2;
      mat1 = (Matrix<float,_2,_2> *)val1;
      bVar6 = bVar5;
      bVar1 = 0;
    } while (!bVar3);
    bVar3 = (bool)(((bVar4 | bVar2) ^ 1) & bVar5);
  }
  return bVar3;
}

Assistant:

bool operator() (const Matrix<T, Rows, Cols>& mat1,
					 const Matrix<T, Rows, Cols>& mat2) const
	{
		for (int col = 0; col < Cols; ++col)
		{
			if (inputLess(mat1[col], mat2[col]))
				return true;
			if (inputLess(mat2[col], mat1[col]))
				return false;
		}

		return false;
	}